

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int cvRcheck2(CVodeMem cv_mem)

{
  bool bVar1;
  N_Vector in_RDI;
  double dVar2;
  sunrealtype unaff_retaddr;
  void *in_stack_00000008;
  int zroot;
  sunrealtype tplus;
  sunrealtype hratio;
  sunrealtype smallh;
  int retval;
  int i;
  N_Vector_Ops local_40;
  int local_14;
  int in_stack_fffffffffffffffc;
  int iVar3;
  
  if (*(int *)((long)&in_RDI[0x67].sunctx + 4) == 0) {
    iVar3 = 0;
  }
  else {
    CVodeGetDky(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffc,in_RDI);
    iVar3 = (*(code *)in_RDI[99].sunctx)
                      (in_RDI[0x65].content,in_RDI[0x12].sunctx,in_RDI[0x66].content,
                       in_RDI[1].content);
    in_RDI[0x68].content = (void *)((long)in_RDI[0x68].content + 1);
    if (iVar3 == 0) {
      bVar1 = false;
      for (local_14 = 0; local_14 < *(int *)&in_RDI[100].content; local_14 = local_14 + 1) {
        *(undefined4 *)((long)&(in_RDI[100].ops)->nvgetvectorid + (long)local_14 * 4) = 0;
      }
      for (local_14 = 0; local_14 < *(int *)&in_RDI[100].content; local_14 = local_14 + 1) {
        if (((*(int *)((long)&(in_RDI[0x68].ops)->nvgetvectorid + (long)local_14 * 4) != 0) &&
            (dVar2 = ABS(*(double *)((long)in_RDI[0x66].content + (long)local_14 * 8)), dVar2 == 0.0
            )) && (!NAN(dVar2))) {
          bVar1 = true;
          *(undefined4 *)((long)&(in_RDI[100].ops)->nvgetvectorid + (long)local_14 * 4) = 1;
        }
      }
      if (bVar1) {
        in_RDI[0x67].ops =
             (N_Vector_Ops)
             ((ABS((double)in_RDI[0x2b].content) + ABS((double)in_RDI[0x29].ops)) *
              (double)in_RDI->ops * 100.0);
        if ((double)in_RDI[0x29].ops <= 0.0) {
          local_40 = (N_Vector_Ops)((ulong)in_RDI[0x67].ops ^ 0x8000000000000000);
        }
        else {
          local_40 = in_RDI[0x67].ops;
        }
        dVar2 = (double)in_RDI[0x65].content + (double)local_40;
        if ((dVar2 - (double)in_RDI[0x2b].content) * (double)in_RDI[0x29].ops < 0.0) {
          CVodeGetDky(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffc,in_RDI);
        }
        else {
          N_VLinearSum(0x3ff0000000000000,(double)local_40 / (double)in_RDI[0x29].ops,
                       in_RDI[0x12].sunctx,in_RDI[0xe].ops,in_RDI[0x12].sunctx);
        }
        iVar3 = (*(code *)in_RDI[99].sunctx)
                          (dVar2,in_RDI[0x12].sunctx,in_RDI[0x66].ops,in_RDI[1].content);
        in_RDI[0x68].content = (void *)((long)in_RDI[0x68].content + 1);
        if (iVar3 == 0) {
          bVar1 = false;
          for (local_14 = 0; local_14 < *(int *)&in_RDI[100].content; local_14 = local_14 + 1) {
            if (*(int *)((long)&(in_RDI[0x68].ops)->nvgetvectorid + (long)local_14 * 4) != 0) {
              dVar2 = ABS((double)(&(in_RDI[0x66].ops)->nvgetvectorid)[local_14]);
              if ((dVar2 != 0.0) || (NAN(dVar2))) {
                if (*(int *)((long)&(in_RDI[100].ops)->nvgetvectorid + (long)local_14 * 4) == 1) {
                  *(_func_N_Vector_ID_N_Vector **)((long)in_RDI[0x66].content + (long)local_14 * 8)
                       = (&(in_RDI[0x66].ops)->nvgetvectorid)[local_14];
                }
              }
              else {
                if (*(int *)((long)&(in_RDI[100].ops)->nvgetvectorid + (long)local_14 * 4) == 1) {
                  return 3;
                }
                bVar1 = true;
                *(undefined4 *)((long)&(in_RDI[100].ops)->nvgetvectorid + (long)local_14 * 4) = 1;
              }
            }
          }
          if (bVar1) {
            iVar3 = 1;
          }
          else {
            iVar3 = 0;
          }
        }
        else {
          iVar3 = -0xc;
        }
      }
      else {
        iVar3 = 0;
      }
    }
    else {
      iVar3 = -0xc;
    }
  }
  return iVar3;
}

Assistant:

static int cvRcheck2(CVodeMem cv_mem)
{
  int i, retval;
  sunrealtype smallh, hratio, tplus;
  sunbooleantype zroot;

  if (cv_mem->cv_irfnd == 0) { return (CV_SUCCESS); }

  (void)CVodeGetDky(cv_mem, cv_mem->cv_tlo, 0, cv_mem->cv_y);
  retval = cv_mem->cv_gfun(cv_mem->cv_tlo, cv_mem->cv_y, cv_mem->cv_glo,
                           cv_mem->cv_user_data);
  cv_mem->cv_nge++;
  if (retval != 0) { return (CV_RTFUNC_FAIL); }

  zroot = SUNFALSE;
  for (i = 0; i < cv_mem->cv_nrtfn; i++) { cv_mem->cv_iroots[i] = 0; }
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    if (!cv_mem->cv_gactive[i]) { continue; }
    if (SUNRabs(cv_mem->cv_glo[i]) == ZERO)
    {
      zroot                = SUNTRUE;
      cv_mem->cv_iroots[i] = 1;
    }
  }
  if (!zroot) { return (CV_SUCCESS); }

  /* One or more g_i has a zero at tlo.  Check g at tlo+smallh. */
  cv_mem->cv_ttol = (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h)) *
                    cv_mem->cv_uround * HUNDRED;
  smallh = (cv_mem->cv_h > ZERO) ? cv_mem->cv_ttol : -cv_mem->cv_ttol;
  tplus  = cv_mem->cv_tlo + smallh;
  if ((tplus - cv_mem->cv_tn) * cv_mem->cv_h >= ZERO)
  {
    hratio = smallh / cv_mem->cv_h;
    N_VLinearSum(ONE, cv_mem->cv_y, hratio, cv_mem->cv_zn[1], cv_mem->cv_y);
  }
  else { (void)CVodeGetDky(cv_mem, tplus, 0, cv_mem->cv_y); }
  retval = cv_mem->cv_gfun(tplus, cv_mem->cv_y, cv_mem->cv_ghi,
                           cv_mem->cv_user_data);
  cv_mem->cv_nge++;
  if (retval != 0) { return (CV_RTFUNC_FAIL); }

  /* Check for close roots (error return), for a new zero at tlo+smallh,
  and for a g_i that changed from zero to nonzero. */
  zroot = SUNFALSE;
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    if (!cv_mem->cv_gactive[i]) { continue; }
    if (SUNRabs(cv_mem->cv_ghi[i]) == ZERO)
    {
      if (cv_mem->cv_iroots[i] == 1) { return (CLOSERT); }
      zroot                = SUNTRUE;
      cv_mem->cv_iroots[i] = 1;
    }
    else
    {
      if (cv_mem->cv_iroots[i] == 1) { cv_mem->cv_glo[i] = cv_mem->cv_ghi[i]; }
    }
  }
  if (zroot) { return (RTFOUND); }
  return (CV_SUCCESS);
}